

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_543c74::ObjCProtoName::isObjCObject(ObjCProtoName *this)

{
  Node *pNVar1;
  Node *pNVar2;
  
  if ((this->super_Node).K == KNameType) {
    pNVar1 = this->Ty;
    pNVar2 = (Node *)(this->Protocol).First;
    if ((long)pNVar2 - (long)pNVar1 == 0xb) {
      if (pNVar2 != pNVar1) {
        return *(long *)((long)&pNVar1->_vptr_Node + 3) == 0x7463656a626f5f63 &&
               pNVar1->_vptr_Node == (_func_int **)0x6a626f5f636a626f;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool isObjCObject() const {
    return Ty->getKind() == KNameType &&
           static_cast<NameType *>(Ty)->getName() == "objc_object";
  }